

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_type.cpp
# Opt level: O0

ostream * operator<<(ostream *stream,node_type id)

{
  ostream *poVar1;
  int iVar2;
  const_reference pvVar3;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
  *local_20;
  node_type local_11;
  ostream *poStack_10;
  node_type id_local;
  ostream *stream_local;
  
  local_11 = id;
  poStack_10 = stream;
  if (operator<<(std::ostream&,node_type)::name_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&operator<<(std::ostream&,node_type)::name_abi_cxx11_);
    if (iVar2 != 0) {
      local_20 = &operator<<(std::ostream&,node_type)::name_abi_cxx11_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&operator<<(std::ostream&,node_type)::name_abi_cxx11_,"D",&local_21);
      local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
                  *)0x187bc8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 1),"P0",
                 local_35);
      local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
                  *)0x187be8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 2),"I1",
                 &local_36);
      local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
                  *)0x187c08;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 3),"P1",
                 &local_37);
      local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
                  *)0x187c28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 4),"I2",
                 &local_38);
      local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
                  *)0x187c48;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 5),"P2",
                 &local_39);
      local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
                  *)0x187c68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 6),"I3",
                 &local_3a);
      local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
                  *)0x187c88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 7),"P3",
                 &local_3b);
      local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
                  *)0x187ca8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 8),"I4",
                 &local_3c);
      local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
                  *)0x187cc8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 9),"P4",
                 &local_3d);
      local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
                  *)0x187ce8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 10),"P5"
                 ,&local_3e);
      local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
                  *)0x187d08;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 0xb),
                 "P6",&local_3f);
      local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
                  *)0x187d28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 0xc),
                 "P7",&local_40);
      std::allocator<char>::~allocator(&local_40);
      std::allocator<char>::~allocator(&local_3f);
      std::allocator<char>::~allocator(&local_3e);
      std::allocator<char>::~allocator(&local_3d);
      std::allocator<char>::~allocator(&local_3c);
      std::allocator<char>::~allocator(&local_3b);
      std::allocator<char>::~allocator(&local_3a);
      std::allocator<char>::~allocator(&local_39);
      std::allocator<char>::~allocator(&local_38);
      std::allocator<char>::~allocator(&local_37);
      std::allocator<char>::~allocator(&local_36);
      std::allocator<char>::~allocator(local_35);
      std::allocator<char>::~allocator(&local_21);
      __cxa_atexit(std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
                   ::~array,&operator<<(std::ostream&,node_type)::name_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&operator<<(std::ostream&,node_type)::name_abi_cxx11_);
    }
  }
  poVar1 = poStack_10;
  pvVar3 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
           ::operator[](&operator<<(std::ostream&,node_type)::name_abi_cxx11_,
                        (long)(int)(local_11 - 1));
  std::operator<<(poVar1,(string *)pvVar3);
  return poStack_10;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, node_type id)
{
    static const std::array<std::string, 13> name = { "D", "P0", "I1", "P1", "I2", "P2", "I3", "P3", "I4", "P4", "P5", "P6", "P7"};
    stream << name[id - 1];
    return stream;
}